

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.cc
# Opt level: O3

ostream * avro::operator<<(ostream *os,indent x)

{
  int iVar1;
  
  if (operator<<(std::ostream&,avro::indent)::spaces_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&operator<<(std::ostream&,avro::indent)::spaces_abi_cxx11_);
    if (iVar1 != 0) {
      operator<<(std::ostream&,avro::indent)::spaces_abi_cxx11_._M_dataplus._M_p =
           (pointer)&operator<<(std::ostream&,avro::indent)::spaces_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&operator<<(std::ostream&,avro::indent)::spaces_abi_cxx11_,"    ","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &operator<<(std::ostream&,avro::indent)::spaces_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&operator<<(std::ostream&,avro::indent)::spaces_abi_cxx11_);
    }
  }
  if (x.d != 0) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                (os,operator<<(std::ostream&,avro::indent)::spaces_abi_cxx11_._M_dataplus._M_p,
                 operator<<(std::ostream&,avro::indent)::spaces_abi_cxx11_._M_string_length);
      x.d = x.d + -1;
    } while (x.d != 0);
  }
  return os;
}

Assistant:

std::ostream& operator <<(std::ostream &os, indent x)
{
    static const std::string spaces("    ");
    while(x.d--) {
        os << spaces; 
    }
    return os;
}